

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_InsertValue_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_InsertValue_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  value_type vVar2;
  char *expected_predicate_value;
  char *actual_predicate_value;
  char *expression_text;
  AssertionResult *assertion_result;
  AssertHelper *this_00;
  AssertHelper *this_01;
  char *pcVar3;
  reference piVar4;
  bool *lhs;
  long in_RDI;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_3;
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  insert_it;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined4 in_stack_fffffffffffff8b8;
  int in_stack_fffffffffffff8bc;
  int index;
  HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8c0;
  bool *in_stack_fffffffffffff8c8;
  undefined4 in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d4;
  int iVar5;
  char *in_stack_fffffffffffff8d8;
  int line;
  char *in_stack_fffffffffffff8e0;
  undefined8 in_stack_fffffffffffff8e8;
  Type type;
  AssertHelper *in_stack_fffffffffffff8f0;
  char *in_stack_fffffffffffff920;
  char *in_stack_fffffffffffff928;
  char *in_stack_fffffffffffff930;
  AssertionResult *in_stack_fffffffffffff938;
  AssertHelper *in_stack_fffffffffffff940;
  string local_6a0 [55];
  undefined1 local_669;
  AssertionResult local_668 [2];
  undefined1 local_641;
  AssertionResult local_640;
  value_type local_62c;
  value_type *in_stack_fffffffffffff9f8;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffa00;
  string local_5d0 [55];
  undefined1 local_599;
  AssertionResult local_598 [2];
  undefined1 local_571;
  AssertionResult local_570;
  value_type local_55c;
  key_type local_494;
  size_type local_490;
  undefined4 local_484;
  AssertionResult local_480 [2];
  key_type local_45c;
  size_type local_458;
  undefined4 local_44c;
  AssertionResult local_448 [2];
  size_type local_428;
  undefined4 local_41c;
  AssertionResult local_418 [6];
  value_type local_3ac;
  value_type local_34c;
  value_type local_2ec;
  value_type local_28c;
  value_type local_22c;
  value_type local_1cc;
  value_type local_16c;
  value_type local_10c;
  string local_108 [55];
  byte local_d1;
  AssertionResult local_d0 [6];
  value_type local_64;
  string local_60 [71];
  undefined1 local_19;
  AssertionResult local_18;
  
  type = (Type)((ulong)in_stack_fffffffffffff8e8 >> 0x20);
  local_19 = google::
             BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::empty((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe0a708);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8c0,
             (bool *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),(type *)0xe0a72a)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff938,in_stack_fffffffffffff930,in_stack_fffffffffffff928,
               in_stack_fffffffffffff920);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8f0,type,in_stack_fffffffffffff8e0,
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_60);
    testing::Message::~Message((Message *)0xe0a7eb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe0a882);
  local_64 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::empty((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xe0a8d8);
  local_d1 = (bVar1 ^ 0xffU) & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8c0,
             (bool *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),(type *)0xe0a8fc)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff938,in_stack_fffffffffffff930,in_stack_fffffffffffff928,
               in_stack_fffffffffffff920);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8f0,type,in_stack_fffffffffffff8e0,
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff940,(Message *)in_stack_fffffffffffff938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_108);
    testing::Message::~Message((Message *)0xe0a9cf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe0aa66);
  local_10c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  local_16c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  expected_predicate_value = (char *)(in_RDI + 0x10);
  local_1cc = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  actual_predicate_value = (char *)(in_RDI + 0x10);
  local_22c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  expression_text = (char *)(in_RDI + 0x10);
  local_28c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  assertion_result = (AssertionResult *)(in_RDI + 0x10);
  local_2ec = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  this_00 = (AssertHelper *)(in_RDI + 0x10);
  local_34c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  local_3ac = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  local_41c = 9;
  local_428 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe0ac8c);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff8d8,
             (char *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             (uint *)in_stack_fffffffffffff8c8,(unsigned_long *)in_stack_fffffffffffff8c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_418);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8f0);
    testing::AssertionResult::failure_message((AssertionResult *)0xe0ad05);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8f0,type,in_stack_fffffffffffff8e0,
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    testing::Message::~Message((Message *)0xe0ad62);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe0add3);
  local_44c = 1;
  local_45c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
  local_458 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff8c0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff8d8,
             (char *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             (uint *)in_stack_fffffffffffff8c8,(unsigned_long *)in_stack_fffffffffffff8c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_448);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8f0);
    testing::AssertionResult::failure_message((AssertionResult *)0xe0ae8e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff8f0,type,in_stack_fffffffffffff8e0,
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    testing::Message::~Message((Message *)0xe0aeeb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe0af5c);
  local_484 = 1;
  this_01 = (AssertHelper *)(in_RDI + 0x10);
  local_494 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
  local_490 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff8c0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff8d8,
             (char *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             (uint *)in_stack_fffffffffffff8c8,(unsigned_long *)in_stack_fffffffffffff8c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_480);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0xe0b017);
    type = (Type)((ulong)pcVar3 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,in_stack_fffffffffffff8e0,
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    testing::Message::~Message((Message *)0xe0b074);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe0b0e5);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  ::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool,_true>
            ((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
              *)in_stack_fffffffffffff8c0);
  pcVar3 = (char *)(in_RDI + 0x10);
  local_55c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
               *)in_stack_fffffffffffff8c0,
              (type)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  local_571 = 0;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            (in_stack_fffffffffffff8d8,
             (char *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
             in_stack_fffffffffffff8c8,(bool *)in_stack_fffffffffffff8c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_570);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    in_stack_fffffffffffff8d8 =
         testing::AssertionResult::failure_message((AssertionResult *)0xe0b1c3);
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,pcVar3,(int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    testing::Message::~Message((Message *)0xe0b220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe0b28e);
  piVar4 = google::
           sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::operator*((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)0xe0b29b);
  iVar5 = *piVar4;
  vVar2 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
  local_599 = iVar5 == vVar2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8c0,
             (bool *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8),(type *)0xe0b2e0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_598);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,expression_text,actual_predicate_value,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,pcVar3,(int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
               (char *)CONCAT44(iVar5,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_5d0);
    testing::Message::~Message((Message *)0xe0b3b3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe0b44a);
  lhs = (bool *)(in_RDI + 0x10);
  local_62c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  std::
  pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  ::operator=((pair<google::BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
               *)in_stack_fffffffffffff8c0,
              (type)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  local_641 = 1;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            (in_stack_fffffffffffff8d8,(char *)CONCAT44(iVar5,in_stack_fffffffffffff8d0),lhs,
             (bool *)in_stack_fffffffffffff8c0);
  line = (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_640);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    in_stack_fffffffffffff8c0 =
         (HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xe0b51b);
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,pcVar3,line,(char *)CONCAT44(iVar5,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    testing::Message::~Message((Message *)0xe0b578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe0b5e6);
  piVar4 = google::
           sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::operator*((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)0xe0b5f3);
  index = *piVar4;
  vVar2 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffff8c0,index);
  local_669 = index == vVar2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8c0,
             (bool *)CONCAT44(index,in_stack_fffffffffffff8b8),(type *)0xe0b638);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_668);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,expression_text,actual_predicate_value,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,pcVar3,line,(char *)CONCAT44(iVar5,in_stack_fffffffffffff8d0));
    testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_6a0);
    testing::Message::~Message((Message *)0xe0b70b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe0b799);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, InsertValue) {
  // First, try some straightforward insertions.
  EXPECT_TRUE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1111)));

  // Check the return type.
  pair<typename TypeParam::iterator, bool> insert_it;
  insert_it = this->ht_.insert(this->UniqueObject(1));
  EXPECT_EQ(false, insert_it.second);  // false: already present
  EXPECT_TRUE(*insert_it.first == this->UniqueObject(1));

  insert_it = this->ht_.insert(this->UniqueObject(2));
  EXPECT_EQ(true, insert_it.second);  // true: not already present
  EXPECT_TRUE(*insert_it.first == this->UniqueObject(2));
}